

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O2

void ScaleRowDown2Box_SSSE3(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  undefined1 (*pauVar1) [16];
  bool bVar2;
  undefined1 *puVar3;
  undefined1 (*pauVar4) [16];
  int iVar5;
  short sVar6;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar7 [16];
  short sVar14;
  short sVar15;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  undefined1 auVar16 [16];
  short sVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  do {
    auVar16 = *(undefined1 (*) [16])src_ptr;
    pauVar1 = (undefined1 (*) [16])((long)src_ptr + 0x10);
    puVar3 = *(undefined1 (*) [16])src_ptr;
    pauVar4 = (undefined1 (*) [16])((long)src_ptr + 0x10);
    src_ptr = (uint8_t *)((long)src_ptr + 0x20);
    auVar7[8] = 1;
    auVar7._0_8_ = 0x101010101010101;
    auVar7[9] = 1;
    auVar7[10] = 1;
    auVar7[0xb] = 1;
    auVar7[0xc] = 1;
    auVar7[0xd] = 1;
    auVar7[0xe] = 1;
    auVar7[0xf] = 1;
    auVar7 = pmaddubsw(auVar16,auVar7);
    auVar16[8] = 1;
    auVar16._0_8_ = 0x101010101010101;
    auVar16[9] = 1;
    auVar16[10] = 1;
    auVar16[0xb] = 1;
    auVar16[0xc] = 1;
    auVar16[0xd] = 1;
    auVar16[0xe] = 1;
    auVar16[0xf] = 1;
    auVar16 = pmaddubsw(*pauVar1,auVar16);
    auVar24[8] = 1;
    auVar24._0_8_ = 0x101010101010101;
    auVar24[9] = 1;
    auVar24[10] = 1;
    auVar24[0xb] = 1;
    auVar24[0xc] = 1;
    auVar24[0xd] = 1;
    auVar24[0xe] = 1;
    auVar24[0xf] = 1;
    auVar24 = pmaddubsw(*(undefined1 (*) [16])(puVar3 + src_stride),auVar24);
    auVar25[8] = 1;
    auVar25._0_8_ = 0x101010101010101;
    auVar25[9] = 1;
    auVar25[10] = 1;
    auVar25[0xb] = 1;
    auVar25[0xc] = 1;
    auVar25[0xd] = 1;
    auVar25[0xe] = 1;
    auVar25[0xf] = 1;
    auVar25 = pmaddubsw(*(undefined1 (*) [16])(*pauVar4 + src_stride),auVar25);
    sVar6 = pavgw((ushort)(auVar7._0_2_ + auVar24._0_2_) >> 1,0);
    sVar8 = pavgw((ushort)(auVar7._2_2_ + auVar24._2_2_) >> 1,0);
    sVar9 = pavgw((ushort)(auVar7._4_2_ + auVar24._4_2_) >> 1,0);
    sVar10 = pavgw((ushort)(auVar7._6_2_ + auVar24._6_2_) >> 1,0);
    sVar11 = pavgw((ushort)(auVar7._8_2_ + auVar24._8_2_) >> 1,0);
    sVar12 = pavgw((ushort)(auVar7._10_2_ + auVar24._10_2_) >> 1,0);
    sVar13 = pavgw((ushort)(auVar7._12_2_ + auVar24._12_2_) >> 1,0);
    sVar14 = pavgw((ushort)(auVar7._14_2_ + auVar24._14_2_) >> 1,0);
    sVar15 = pavgw((ushort)(auVar16._0_2_ + auVar25._0_2_) >> 1,0);
    sVar17 = pavgw((ushort)(auVar16._2_2_ + auVar25._2_2_) >> 1,0);
    sVar18 = pavgw((ushort)(auVar16._4_2_ + auVar25._4_2_) >> 1,0);
    sVar19 = pavgw((ushort)(auVar16._6_2_ + auVar25._6_2_) >> 1,0);
    sVar20 = pavgw((ushort)(auVar16._8_2_ + auVar25._8_2_) >> 1,0);
    sVar21 = pavgw((ushort)(auVar16._10_2_ + auVar25._10_2_) >> 1,0);
    sVar22 = pavgw((ushort)(auVar16._12_2_ + auVar25._12_2_) >> 1,0);
    sVar23 = pavgw((ushort)(auVar16._14_2_ + auVar25._14_2_) >> 1,0);
    *dst_ptr = (0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 - (0xff < sVar6);
    dst_ptr[1] = (0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 - (0xff < sVar8);
    dst_ptr[2] = (0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9);
    dst_ptr[3] = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10);
    dst_ptr[4] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11);
    dst_ptr[5] = (0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12);
    dst_ptr[6] = (0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13);
    dst_ptr[7] = (0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14);
    dst_ptr[8] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
    dst_ptr[9] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
    dst_ptr[10] = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
    dst_ptr[0xb] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
    dst_ptr[0xc] = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
    dst_ptr[0xd] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
    dst_ptr[0xe] = (0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22);
    dst_ptr[0xf] = (0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 - (0xff < sVar23);
    dst_ptr = dst_ptr + 0x10;
    iVar5 = dst_width + -0x10;
    bVar2 = 0xf < dst_width;
    dst_width = iVar5;
  } while (iVar5 != 0 && bVar2);
  return;
}

Assistant:

void ScaleRowDown2Box_SSSE3(const uint8_t* src_ptr,
                            ptrdiff_t src_stride,
                            uint8_t* dst_ptr,
                            int dst_width) {
  asm volatile(
      "pcmpeqb     %%xmm4,%%xmm4                 \n"
      "psrlw       $0xf,%%xmm4                   \n"
      "packuswb    %%xmm4,%%xmm4                 \n"
      "pxor        %%xmm5,%%xmm5                 \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "movdqu      0x00(%0,%3,1),%%xmm2          \n"
      "movdqu      0x10(%0,%3,1),%%xmm3          \n"
      "lea         0x20(%0),%0                   \n"
      "pmaddubsw   %%xmm4,%%xmm0                 \n"
      "pmaddubsw   %%xmm4,%%xmm1                 \n"
      "pmaddubsw   %%xmm4,%%xmm2                 \n"
      "pmaddubsw   %%xmm4,%%xmm3                 \n"
      "paddw       %%xmm2,%%xmm0                 \n"
      "paddw       %%xmm3,%%xmm1                 \n"
      "psrlw       $0x1,%%xmm0                   \n"
      "psrlw       $0x1,%%xmm1                   \n"
      "pavgw       %%xmm5,%%xmm0                 \n"
      "pavgw       %%xmm5,%%xmm1                 \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
      : "+r"(src_ptr),               // %0
        "+r"(dst_ptr),               // %1
        "+r"(dst_width)              // %2
      : "r"((intptr_t)(src_stride))  // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm5");
}